

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O3

double * inform_integration_evidence
                   (int *series,size_t l,size_t n,int *b,double *evidence,inform_error *err)

{
  double dVar1;
  _Bool _Var2;
  inform_error iVar3;
  double *pdVar4;
  double *__ptr;
  size_t sVar5;
  size_t *xs;
  double dVar6;
  
  if (series == (int *)0x0) {
    iVar3 = INFORM_ETIMESERIES;
  }
  else {
    if (1 < l) {
      if (evidence == (double *)0x0) {
        __ptr = (double *)malloc(n << 4);
        if (__ptr != (double *)0x0) {
          pdVar4 = (double *)malloc(n * 8);
          if (pdVar4 != (double *)0x0) goto LAB_001597e0;
          free(__ptr);
        }
      }
      else {
        pdVar4 = (double *)malloc(n * 8);
        __ptr = evidence;
        if (pdVar4 != (double *)0x0) {
LAB_001597e0:
          if (n != 0) {
            sVar5 = 0;
            do {
              __ptr[sVar5] = INFINITY;
              __ptr[n + sVar5] = -INFINITY;
              sVar5 = sVar5 + 1;
            } while (n != sVar5);
          }
          xs = inform_first_partitioning(l);
          while (sVar5 = inform_next_partitioning(xs,l), sVar5 != 0) {
            inform_integration_evidence_part(series,l,n,b,xs,sVar5,pdVar4,err);
            _Var2 = inform_failed(err);
            if (_Var2) break;
            if (n != 0) {
              sVar5 = 0;
              do {
                dVar1 = pdVar4[sVar5];
                dVar6 = __ptr[sVar5];
                if (dVar1 <= __ptr[sVar5]) {
                  dVar6 = dVar1;
                }
                __ptr[sVar5] = dVar6;
                dVar6 = __ptr[n + sVar5];
                if (__ptr[n + sVar5] <= dVar1) {
                  dVar6 = dVar1;
                }
                __ptr[n + sVar5] = dVar6;
                sVar5 = sVar5 + 1;
              } while (n != sVar5);
            }
          }
          free(xs);
          free(pdVar4);
          _Var2 = inform_failed(err);
          pdVar4 = (double *)0x0;
          if (!_Var2) {
            pdVar4 = __ptr;
          }
          if (_Var2 && evidence == (double *)0x0) {
            free(__ptr);
            return (double *)0x0;
          }
          return pdVar4;
        }
      }
      if (err == (inform_error *)0x0) {
        return (double *)0x0;
      }
      *err = INFORM_ENOMEM;
      return (double *)0x0;
    }
    iVar3 = INFORM_ENOSOURCES;
  }
  if (err != (inform_error *)0x0) {
    *err = iVar3;
  }
  return (double *)0x0;
}

Assistant:

double *inform_integration_evidence(int const *series, size_t l, size_t n,
    int const *b, double *evidence, inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate = (evidence == NULL);
    if (allocate)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    double *lmi = malloc(n * sizeof(double));
    if (lmi == NULL)
    {
        if (allocate) free(evidence);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    double *minimum = evidence;
    double *maximum = minimum + n;
    for (size_t i = 0; i < n; ++i)
    {
        minimum[i] = INFINITY;
        maximum[i] = -INFINITY;
    }

    size_t *parts = inform_first_partitioning(l);
    size_t nparts = 1;
    while ((nparts = inform_next_partitioning(parts, l)))
    {
        inform_integration_evidence_part(series, l, n, b, parts, nparts, lmi, err);
        if (inform_failed(err))
        {
            break;
        }
        for (size_t i = 0; i < n; ++i)
        {
            minimum[i] = MIN(minimum[i], lmi[i]);
            maximum[i] = MAX(maximum[i], lmi[i]);
        }
    }
    free(parts);
    free(lmi);
    
    if (inform_failed(err))
    {
        if (allocate)
        {
            free(evidence);
        }
        return NULL;
    }

    return evidence;
}